

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O2

void libdef_rec(BuildCtx *ctx,char *p,int arg)

{
  uint8_t *__dest;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  long lVar5;
  char *__s;
  char *local_38;
  
  if (ctx->mode != BUILD_recdef) {
    return;
  }
  for (; recffid + 1 < ffid; recffid = recffid + 1) {
    fwrite(",\n0",3,1,(FILE *)ctx->fp);
  }
  recffid = ffid;
  __s = funcname;
  if (*p != '.') {
    __s = p;
  }
  pcVar2 = strchr(__s,0x20);
  if (pcVar2 == (char *)0x0) {
    local_38 = (char *)0x0;
  }
  else {
    local_38 = pcVar2 + 1;
    *pcVar2 = '\0';
  }
  uVar4 = 2;
  for (lVar5 = 0; __dest = obuf + lVar5, obuf[lVar5] != '\0'; lVar5 = lVar5 + sVar3 + 1) {
    iVar1 = strcmp((char *)__dest,__s);
    if (iVar1 == 0) goto LAB_0010a659;
    sVar3 = strlen((char *)__dest);
    uVar4 = uVar4 + 1;
  }
  sVar3 = strlen(__s);
  if (0x1ffe < (long)(sVar3 + lVar5)) {
    fwrite("Error: output buffer overflow\n",0x1e,1,_stderr);
    exit(1);
  }
  strcpy((char *)__dest,__s);
LAB_0010a659:
  if (local_38 == (char *)0x0) {
    fprintf((FILE *)ctx->fp,",\n0x%02x00",(ulong)uVar4);
    return;
  }
  fprintf((FILE *)ctx->fp,",\n0x%02x00+(%s)",(ulong)uVar4);
  return;
}

Assistant:

static void libdef_rec(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_recdef) {
    char *q;
    uint32_t n;
    for (; recffid+1 < ffid; recffid++)
      fprintf(ctx->fp, ",\n0");
    recffid = ffid;
    if (*p == '.') p = funcname;
    q = strchr(p, ' ');
    if (q) *q++ = '\0';
    n = find_rec(p);
    if (q)
      fprintf(ctx->fp, ",\n0x%02x00+(%s)", n, q);
    else
      fprintf(ctx->fp, ",\n0x%02x00", n);
  }
}